

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<unsigned_long>::test_one<(libdivide::Branching)0>
          (DivideTest<unsigned_long> *this,unsigned_long numer,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)0> *the_divider)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  string_class result;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40 [4];
  
  uVar5 = (the_divider->div).denom.magic;
  bVar1 = (the_divider->div).denom.more;
  uVar4 = (ulong)bVar1;
  if (uVar5 == 0) {
    uVar5 = numer >> (uVar4 & 0x3f);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = numer;
    uVar5 = SUB168(auVar2 * auVar3,8);
    if ((bVar1 & 0x40) == 0) {
      uVar5 = uVar5 >> (uVar4 & 0x3f);
    }
    else {
      uVar5 = (numer - uVar5 >> 1) + uVar5 >> (uVar4 & 0x3f);
    }
  }
  if (uVar5 == numer / denom) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failure for ",0xc);
  local_50 = local_40;
  local_40[0] = 0x343675;
  local_48 = 3;
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,numer);
  std::operator<<((ostream *)&std::cerr," / ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr," = ");
  std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,uVar5);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }